

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O0

uint64_t __thiscall double_conversion::Double::Significand(Double *this)

{
  bool bVar1;
  uint64_t uVar2;
  Double *in_RDI;
  uint64_t significand;
  uint64_t d64;
  Double *local_8;
  
  uVar2 = AsUint64(in_RDI);
  local_8 = (Double *)(uVar2 & 0xfffffffffffff);
  bVar1 = IsDenormal(local_8);
  if (!bVar1) {
    local_8 = local_8 + 0x2000000000000;
  }
  return (uint64_t)local_8;
}

Assistant:

uint64_t Significand() const {
    uint64_t d64 = AsUint64();
    uint64_t significand = d64 & kSignificandMask;
    if (!IsDenormal()) {
      return significand + kHiddenBit;
    } else {
      return significand;
    }
  }